

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D.c
# Opt level: O0

int Jac(N_Vector v,N_Vector Jv,sunrealtype t,N_Vector y,N_Vector fy,void *user_data,N_Vector tmp)

{
  double dVar1;
  double dVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long *in_R8;
  double dVar7;
  sunindextype i;
  sunrealtype c2;
  sunrealtype c1;
  sunrealtype *JV;
  sunrealtype *V;
  sunrealtype dx;
  sunrealtype k;
  sunindextype N;
  UserData udata;
  undefined8 in_stack_ffffffffffffff78;
  int opt;
  long lVar8;
  char *in_stack_ffffffffffffff80;
  void *in_stack_ffffffffffffff88;
  int local_4;
  
  lVar3 = *in_R8;
  dVar1 = (double)in_R8[2];
  dVar2 = (double)in_R8[1];
  lVar5 = N_VGetArrayPointer(in_RDI);
  opt = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  iVar4 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
  if (iVar4 == 0) {
    puVar6 = (undefined8 *)N_VGetArrayPointer(in_RSI);
    iVar4 = check_flag(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,opt);
    if (iVar4 == 0) {
      N_VConst(0,in_RSI);
      dVar7 = (dVar1 / dVar2) / dVar2;
      *puVar6 = 0;
      for (lVar8 = 1; lVar8 < lVar3 + -1; lVar8 = lVar8 + 1) {
        puVar6[lVar8] =
             dVar7 * *(double *)(lVar5 + 8 + lVar8 * 8) +
             dVar7 * *(double *)(lVar5 + (lVar8 + -1) * 8) +
             (((dVar1 * -2.0) / dVar2) / dVar2) * *(double *)(lVar5 + lVar8 * 8);
      }
      puVar6[lVar3 + -1] = 0;
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int Jac(N_Vector v, N_Vector Jv, sunrealtype t, N_Vector y, N_Vector fy,
               void* user_data, N_Vector tmp)
{
  UserData udata = (UserData)user_data; /* variable shortcuts */
  sunindextype N = udata->N;
  sunrealtype k  = udata->k;
  sunrealtype dx = udata->dx;
  sunrealtype *V = NULL, *JV = NULL;
  sunrealtype c1, c2;
  sunindextype i;

  V = N_VGetArrayPointer(v); /* access data arrays */
  if (check_flag((void*)V, "N_VGetArrayPointer", 0)) { return 1; }
  JV = N_VGetArrayPointer(Jv);
  if (check_flag((void*)JV, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, Jv); /* initialize Jv product to zero */

  /* iterate over domain, computing all Jacobian-vector products */
  c1    = k / dx / dx;
  c2    = -SUN_RCONST(2.0) * k / dx / dx;
  JV[0] = 0.0;
  for (i = 1; i < N - 1; i++)
  {
    JV[i] = c1 * V[i - 1] + c2 * V[i] + c1 * V[i + 1];
  }
  JV[N - 1] = 0.0;

  return 0; /* Return with success */
}